

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::loadModel(FastText *this,istream *in)

{
  shared_ptr<fasttext::Matrix> *this_00;
  element_type *peVar1;
  element_type *peVar2;
  invalid_argument *this_01;
  bool quant_input;
  __shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::make_shared<fasttext::Args>();
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::make_shared<fasttext::DenseMatrix>();
  this_00 = &this->input_;
  std::__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::make_shared<fasttext::DenseMatrix>();
  std::__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2> *)&this->output_,
             (__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  Args::load((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in)
  ;
  if ((this->version == 0xb) &&
     (peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1->model == sup)) {
    peVar1->maxn = 0;
  }
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&,std::istream&>
            ((shared_ptr<fasttext::Args> *)&local_40,
             (basic_istream<char,_std::char_traits<char>_> *)this);
  std::__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::istream::read((char *)in,(long)&quant_input);
  if (quant_input == true) {
    this->quant_ = true;
    std::make_shared<fasttext::QuantMatrix>();
    std::__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<fasttext::QuantMatrix,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  peVar2 = (this_00->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar2->_vptr_Matrix[8])(peVar2,in);
  if ((quant_input == false) &&
     (-1 < ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->pruneidx_size_)) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,
               "Invalid model file.\nPlease download the updated model from www.fasttext.cc.\nSee issue #332 on Github for more information.\n"
              );
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::istream::read((char *)in,
                     (long)&((this->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->qout);
  if ((this->quant_ == true) &&
     (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout ==
      true)) {
    std::make_shared<fasttext::QuantMatrix>();
    std::__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2> *)&this->output_,
               (__shared_ptr<fasttext::QuantMatrix,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  peVar2 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_Matrix[8])(peVar2,in);
  buildModel(this);
  return;
}

Assistant:

void FastText::loadModel(std::istream& in) {
  args_ = std::make_shared<Args>();
  input_ = std::make_shared<DenseMatrix>();
  output_ = std::make_shared<DenseMatrix>();
  args_->load(in);
  if (version == 11 && args_->model == model_name::sup) {
    // backward compatibility: old supervised models do not use char ngrams.
    args_->maxn = 0;
  }
  dict_ = std::make_shared<Dictionary>(args_, in);

  bool quant_input;
  in.read((char*)&quant_input, sizeof(bool));
  if (quant_input) {
    quant_ = true;
    input_ = std::make_shared<QuantMatrix>();
  }
  input_->load(in);

  if (!quant_input && dict_->isPruned()) {
    throw std::invalid_argument(
        "Invalid model file.\n"
        "Please download the updated model from www.fasttext.cc.\n"
        "See issue #332 on Github for more information.\n");
  }

  in.read((char*)&args_->qout, sizeof(bool));
  if (quant_ && args_->qout) {
    output_ = std::make_shared<QuantMatrix>();
  }
  output_->load(in);

  buildModel();
}